

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_smartAlloc.cpp
# Opt level: O2

double ** __thiscall
PP_smartAlloc::allocateDouble(PP_smartAlloc *this,unsigned_long _Nt,unsigned_long _Nz)

{
  double **ppdVar1;
  double *pdVar2;
  unsigned_long i;
  unsigned_long uVar3;
  
  ppdVar1 = (double **)operator_new__(-(ulong)(_Nt >> 0x3d != 0) | _Nt * 8);
  for (uVar3 = 0; _Nt != uVar3; uVar3 = uVar3 + 1) {
    pdVar2 = (double *)operator_new__(-(ulong)(_Nz >> 0x3d != 0) | _Nz << 3);
    ppdVar1[uVar3] = pdVar2;
  }
  return ppdVar1;
}

Assistant:

double ** PP_smartAlloc::allocateDouble(unsigned long _Nt, unsigned long _Nz)
{
    double** _M = new double*[_Nt];
    if(_M!=NULL)
    {
        unsigned long I = _Nt+1;
        for(unsigned long i=0 ; i<_Nt ; i++)
        {
            _M[i] = new double[_Nz];
            if(_M[i]==NULL)
            {
                I=i;
                i=_Nt;
            }
        }
        if(I!=(_Nt+1))
        {
            for(unsigned long i=0 ; i<I ; i++)
            {
                delete _M[i];
            }
            delete _M;
            _M = NULL;
        }
    }
    return _M;
}